

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O1

void __thiscall
ObserverManager_Clear_Test::~ObserverManager_Clear_Test(ObserverManager_Clear_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ObserverManager, Clear)  {
    std::stringstream out;

    A* a1 = new A(out, "Tic");
    ObserverManager::subscribe<FooBarProtocol>(a1);
    
    A* a2 = new A(out, "Tic");
    ObserverManager::subscribe<FooBarProtocol>(a2);
    
    ObserverManager::notify(&FooBarProtocol::foo);
    ObserverManager::notify(&FooBarProtocol::bar, "Tac");
    
    ObserverManager::clear<FooBarProtocol>();
    
    ObserverManager::notify(&FooBarProtocol::foo);
    ObserverManager::notify(&FooBarProtocol::bar, "Tac");

    delete a1;
    delete a2;

    EXPECT_EQ("Tic Tic Tac Tac ", out.str());
}